

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void upb_MtDecoder_ParseMessage(upb_MtDecoder *d,char *data,size_t len)

{
  int iVar1;
  uint uVar2;
  upb_SubCounts uVar3;
  _Bool _Var4;
  upb_MiniTable *puVar5;
  char *pcVar6;
  ulong uVar7;
  upb_MiniTableField *puVar8;
  upb_MiniTableField *puVar9;
  upb_MiniTableSubInternal *puVar10;
  ulong uVar11;
  char *pcVar12;
  upb_Arena *puVar13;
  uint16_t uVar14;
  ulong uVar15;
  upb_SubCounts sub_counts;
  upb_SubCounts local_34;
  
  if (len < 0x1555555555555556) {
    puVar13 = d->arena;
    uVar15 = len * 0xc + 7 & 0xfffffffffffffff8;
    puVar9 = (upb_MiniTableField *)puVar13->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)puVar13->end_dont_copy_me__upb_internal_use_only - (long)puVar9) < uVar15) {
      puVar9 = (upb_MiniTableField *)
               _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar13,uVar15);
    }
    else {
      if ((upb_MiniTableField *)((ulong)((long)&puVar9->presence + 1U) & 0xfffffffffffffff8) !=
          puVar9) goto LAB_002f8994;
      puVar13->ptr_dont_copy_me__upb_internal_use_only =
           (char *)((long)&puVar9->number_dont_copy_me__upb_internal_use_only + uVar15);
    }
    d->fields = puVar9;
    if (puVar9 == (upb_MiniTableField *)0x0) goto LAB_002f8983;
    local_34.submsg_count = 0;
    local_34.subenum_count = 0;
    puVar5 = d->table;
    puVar5->field_count_dont_copy_me__upb_internal_use_only = 0;
    puVar5->fields_dont_copy_me__upb_internal_use_only = puVar9;
    upb_MtDecoder_Parse(d,data,len,d->fields,0xc,
                        &d->table->field_count_dont_copy_me__upb_internal_use_only,&local_34);
    puVar9 = d->fields;
    if (puVar9 == (upb_MiniTableField *)0x0) {
      __assert_fail("ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x47,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
    }
    puVar5 = d->table;
    if (len < puVar5->field_count_dont_copy_me__upb_internal_use_only) {
      __assert_fail("size <= oldsize",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x48,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
    }
    uVar11 = (ulong)((uint)puVar5->field_count_dont_copy_me__upb_internal_use_only * 0xc + 7 &
                    0xfffffff8);
    if (uVar11 != uVar15) {
      puVar13 = d->arena;
      if ((char *)((long)&puVar9->number_dont_copy_me__upb_internal_use_only + uVar15) ==
          puVar13->ptr_dont_copy_me__upb_internal_use_only) {
        puVar13->ptr_dont_copy_me__upb_internal_use_only =
             (char *)((long)&puVar9->number_dont_copy_me__upb_internal_use_only + uVar11);
      }
      else {
        _Var4 = _upb_Arena_WasLastAlloc(puVar13,puVar9,uVar15);
        if (!_Var4) {
          __assert_fail("_upb_Arena_WasLastAlloc(a, ptr, oldsize)",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                        ,0x58,
                        "void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
        }
        puVar5 = d->table;
        puVar9 = d->fields;
      }
    }
    uVar3 = local_34;
    puVar5->fields_dont_copy_me__upb_internal_use_only = puVar9;
    uVar11 = (ulong)(uint)local_34;
    uVar2 = (uint)local_34 >> 0x10;
    uVar14 = local_34.submsg_count;
    iVar1 = (int)(uVar11 & 0xffff);
    uVar15 = (ulong)((uVar2 + iVar1) * 8);
    puVar13 = d->arena;
    puVar10 = (upb_MiniTableSubInternal *)puVar13->ptr_dont_copy_me__upb_internal_use_only;
    pcVar6 = puVar13->end_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)pcVar6 - (long)puVar10) < uVar15) {
      puVar10 = (upb_MiniTableSubInternal *)
                _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar13,uVar15);
      puVar13 = d->arena;
      pcVar12 = puVar13->ptr_dont_copy_me__upb_internal_use_only;
      pcVar6 = puVar13->end_dont_copy_me__upb_internal_use_only;
    }
    else {
      if ((upb_MiniTableSubInternal *)((ulong)((long)puVar10 + 7U) & 0xfffffffffffffff8) != puVar10)
      goto LAB_002f8994;
      pcVar12 = (char *)(uVar15 + (long)puVar10);
      puVar13->ptr_dont_copy_me__upb_internal_use_only = pcVar12;
    }
    uVar15 = (ulong)(((uint)uVar3 & 0xffff) << 3);
    if ((ulong)((long)pcVar6 - (long)pcVar12) < uVar15) {
      pcVar12 = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar13,uVar15);
    }
    else {
      if ((char *)((ulong)(pcVar12 + 7) & 0xfffffffffffffff8) != pcVar12) {
LAB_002f8994:
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      puVar13->ptr_dont_copy_me__upb_internal_use_only = pcVar12 + uVar15;
    }
    if ((puVar10 != (upb_MiniTableSubInternal *)0x0) && (pcVar12 != (char *)0x0)) {
      if (iVar1 != 0) {
        uVar7 = 0;
        do {
          *(upb_MiniTable **)(pcVar12 + uVar7) =
               &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
          *(char **)((long)puVar10 + uVar7) = pcVar12 + uVar7;
          uVar7 = uVar7 + 8;
        } while (uVar15 != uVar7);
      }
      if (0xffff < (uint)uVar3) {
        uVar15 = (ulong)d->table->field_count_dont_copy_me__upb_internal_use_only;
        if (uVar15 != 0) {
          puVar8 = d->fields;
          puVar9 = puVar8 + uVar15;
          do {
            if (puVar8->descriptortype_dont_copy_me__upb_internal_use_only == '\x0e') {
              puVar8->submsg_index_dont_copy_me__upb_internal_use_only =
                   puVar8->submsg_index_dont_copy_me__upb_internal_use_only + uVar14;
            }
            puVar8 = puVar8 + 1;
          } while (puVar8 < puVar9);
        }
        memset(puVar10 + (uVar11 & 0xffff),0,(ulong)(uVar2 - 1) * 8 + 8);
      }
      d->table->subs_dont_copy_me__upb_internal_use_only = puVar10;
      return;
    }
  }
LAB_002f8983:
  upb_MdDecoder_ErrorJmp(&d->base,"Out of memory");
}

Assistant:

static void upb_MtDecoder_ParseMessage(upb_MtDecoder* d, const char* data,
                                       size_t len) {
  // Buffer length is an upper bound on the number of fields. We will return
  // what we don't use.
  if (SIZE_MAX / sizeof(*d->fields) < len) {
    upb_MdDecoder_ErrorJmp(&d->base, "Out of memory");
  }
  d->fields = upb_Arena_Malloc(d->arena, sizeof(*d->fields) * len);
  upb_MdDecoder_CheckOutOfMemory(&d->base, d->fields);

  upb_SubCounts sub_counts = {0, 0};
  d->table->UPB_PRIVATE(field_count) = 0;
  d->table->UPB_PRIVATE(fields) = d->fields;
  upb_MtDecoder_Parse(d, data, len, d->fields, sizeof(*d->fields),
                      &d->table->UPB_PRIVATE(field_count), &sub_counts);

  upb_Arena_ShrinkLast(d->arena, d->fields, sizeof(*d->fields) * len,
                       sizeof(*d->fields) * d->table->UPB_PRIVATE(field_count));
  d->table->UPB_PRIVATE(fields) = d->fields;
  upb_MtDecoder_AllocateSubs(d, sub_counts);
}